

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

_Bool player_get_recall_depth(player *p)

{
  bool bVar1;
  int local_2c;
  wchar_t i;
  char *prompt;
  wchar_t new;
  _Bool level_ok;
  player *p_local;
  
  bVar1 = false;
  prompt._0_4_ = L'\0';
  if ((0 < p->max_depth) && (((p->opts).opt[0x20] & 1U) == 0)) {
    while (!bVar1) {
      prompt._0_4_ = get_quantity("Which level do you wish to return to (0 to cancel)? ",
                                  (int)p->max_depth);
      if ((wchar_t)prompt == L'\0') {
        return false;
      }
      for (local_2c = 0; local_2c < (int)(uint)chunk_list_max; local_2c = local_2c + 1) {
        if (chunk_list[local_2c]->depth == (wchar_t)prompt) {
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        msg("You must choose a level you have previously visited.");
      }
    }
    p->recall_depth = (int16_t)(wchar_t)prompt;
  }
  return true;
}

Assistant:

bool player_get_recall_depth(struct player *p)
{
	bool level_ok = false;
	int new = 0;

	/*
	 * No choice when have not entered the dungeon or descent is forced,
	 * so do not prompt.
	 */
	if (p->max_depth <= 0 || OPT(p, birth_force_descend)) {
		return true;
	}
	while (!level_ok) {
		const char *prompt =
			"Which level do you wish to return to (0 to cancel)? ";
		int i;

		/* Choose the level */
		new = get_quantity(prompt, p->max_depth);
		if (new == 0) {
			return false;
		}

		/* Is that level valid? */
		for (i = 0; i < chunk_list_max; i++) {
			if (chunk_list[i]->depth == new) {
				level_ok = true;
				break;
			}
		}
		if (!level_ok) {
			msg("You must choose a level you have previously visited.");
		}
	}
	p->recall_depth = new;
	return true;
}